

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

Ptr __thiscall
core::image::create_for_type(image *this,ImageType type,int width,int height,int channels)

{
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  Ptr PVar2;
  Image<double> *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  _Var1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_00000014,width)
  ;
  switch(type) {
  case IMAGE_TYPE_UINT8:
    local_40 = (Image<double> *)operator_new(0x30);
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (local_40->super_TypedImageBase<double>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012ed08;
    (local_40->super_TypedImageBase<double>).super_ImageBase.w = width;
    (local_40->super_TypedImageBase<double>).super_ImageBase.h = height;
    (local_40->super_TypedImageBase<double>).super_ImageBase.c = channels;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(local_40->super_TypedImageBase<double>).data,(long)(height * width * channels));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_char>*>
              (&local_38,(Image<unsigned_char> *)local_40);
    _Var1._M_pi = extraout_RDX;
    break;
  case IMAGE_TYPE_UINT16:
    local_40 = (Image<double> *)operator_new(0x30);
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (local_40->super_TypedImageBase<double>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012f9e0;
    (local_40->super_TypedImageBase<double>).super_ImageBase.w = width;
    (local_40->super_TypedImageBase<double>).super_ImageBase.h = height;
    (local_40->super_TypedImageBase<double>).super_ImageBase.c = channels;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &(local_40->super_TypedImageBase<double>).data,(long)(height * width * channels));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_short>*>
              (&local_38,(Image<unsigned_short> *)local_40);
    _Var1._M_pi = extraout_RDX_05;
    break;
  case IMAGE_TYPE_UINT32:
    local_40 = (Image<double> *)operator_new(0x30);
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (local_40->super_TypedImageBase<double>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012ef60;
    (local_40->super_TypedImageBase<double>).super_ImageBase.w = width;
    (local_40->super_TypedImageBase<double>).super_ImageBase.h = height;
    (local_40->super_TypedImageBase<double>).super_ImageBase.c = channels;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &(local_40->super_TypedImageBase<double>).data,(long)(height * width * channels));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_int>*>
              (&local_38,(Image<unsigned_int> *)local_40);
    _Var1._M_pi = extraout_RDX_02;
    break;
  case IMAGE_TYPE_UINT64:
    local_40 = (Image<double> *)operator_new(0x30);
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (local_40->super_TypedImageBase<double>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012f0e0;
    (local_40->super_TypedImageBase<double>).super_ImageBase.w = width;
    (local_40->super_TypedImageBase<double>).super_ImageBase.h = height;
    (local_40->super_TypedImageBase<double>).super_ImageBase.c = channels;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &(local_40->super_TypedImageBase<double>).data,(long)(height * width * channels));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_long>*>
              (&local_38,(Image<unsigned_long> *)local_40);
    _Var1._M_pi = extraout_RDX_03;
    break;
  case IMAGE_TYPE_SINT8:
    local_40 = (Image<double> *)operator_new(0x30);
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (local_40->super_TypedImageBase<double>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012f260;
    (local_40->super_TypedImageBase<double>).super_ImageBase.w = width;
    (local_40->super_TypedImageBase<double>).super_ImageBase.h = height;
    (local_40->super_TypedImageBase<double>).super_ImageBase.c = channels;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)
               &(local_40->super_TypedImageBase<double>).data,(long)(height * width * channels));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<signed_char>*>
              (&local_38,(Image<signed_char> *)local_40);
    _Var1._M_pi = extraout_RDX_00;
    break;
  case IMAGE_TYPE_SINT16:
    local_40 = (Image<double> *)operator_new(0x30);
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (local_40->super_TypedImageBase<double>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012f3e0;
    (local_40->super_TypedImageBase<double>).super_ImageBase.w = width;
    (local_40->super_TypedImageBase<double>).super_ImageBase.h = height;
    (local_40->super_TypedImageBase<double>).super_ImageBase.c = channels;
    std::vector<short,_std::allocator<short>_>::resize
              ((vector<short,_std::allocator<short>_> *)
               &(local_40->super_TypedImageBase<double>).data,(long)(height * width * channels));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<short>*>
              (&local_38,(Image<short> *)local_40);
    _Var1._M_pi = extraout_RDX_06;
    break;
  case IMAGE_TYPE_SINT32:
    local_40 = (Image<double> *)operator_new(0x30);
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (local_40->super_TypedImageBase<double>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012f560;
    (local_40->super_TypedImageBase<double>).super_ImageBase.w = width;
    (local_40->super_TypedImageBase<double>).super_ImageBase.h = height;
    (local_40->super_TypedImageBase<double>).super_ImageBase.c = channels;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(local_40->super_TypedImageBase<double>).data,
               (long)(height * width * channels));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<int>*>
              (&local_38,(Image<int> *)local_40);
    _Var1._M_pi = extraout_RDX_07;
    break;
  case IMAGE_TYPE_SINT64:
    local_40 = (Image<double> *)operator_new(0x30);
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (local_40->super_TypedImageBase<double>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012f6e0;
    (local_40->super_TypedImageBase<double>).super_ImageBase.w = width;
    (local_40->super_TypedImageBase<double>).super_ImageBase.h = height;
    (local_40->super_TypedImageBase<double>).super_ImageBase.c = channels;
    std::vector<long,_std::allocator<long>_>::resize
              ((vector<long,_std::allocator<long>_> *)&(local_40->super_TypedImageBase<double>).data
               ,(long)(height * width * channels));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<long>*>
              (&local_38,(Image<long> *)local_40);
    _Var1._M_pi = extraout_RDX_04;
    break;
  case IMAGE_TYPE_FLOAT:
    local_40 = (Image<double> *)operator_new(0x30);
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (local_40->super_TypedImageBase<double>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012fb60;
    (local_40->super_TypedImageBase<double>).super_ImageBase.w = width;
    (local_40->super_TypedImageBase<double>).super_ImageBase.h = height;
    (local_40->super_TypedImageBase<double>).super_ImageBase.c = channels;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)
               &(local_40->super_TypedImageBase<double>).data,(long)(height * width * channels));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
              (&local_38,(Image<float> *)local_40);
    _Var1._M_pi = extraout_RDX_08;
    break;
  case IMAGE_TYPE_DOUBLE:
    local_40 = (Image<double> *)operator_new(0x30);
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (local_40->super_TypedImageBase<double>).data.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (local_40->super_TypedImageBase<double>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012f860;
    (local_40->super_TypedImageBase<double>).super_ImageBase.w = width;
    (local_40->super_TypedImageBase<double>).super_ImageBase.h = height;
    (local_40->super_TypedImageBase<double>).super_ImageBase.c = channels;
    std::vector<double,_std::allocator<double>_>::resize
              (&(local_40->super_TypedImageBase<double>).data,(long)(height * width * channels));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<double>*>
              (&local_38,local_40);
    _Var1._M_pi = extraout_RDX_01;
    break;
  default:
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    goto LAB_00117dce;
  }
  *(Image<double> **)this = local_40;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_38._M_pi;
LAB_00117dce:
  PVar2.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  PVar2.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar2.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline ImageBase::Ptr
create_for_type (ImageType type, int width, int height, int channels)
{
    switch (type)
    {
        case IMAGE_TYPE_UINT8:
            return Image<uint8_t>::create(width, height, channels);
        case IMAGE_TYPE_UINT16:
            return Image<uint16_t>::create(width, height, channels);
        case IMAGE_TYPE_UINT32:
            return Image<uint32_t>::create(width, height, channels);
        case IMAGE_TYPE_UINT64:
            return Image<uint64_t>::create(width, height, channels);
        case IMAGE_TYPE_SINT8:
            return Image<int8_t>::create(width, height, channels);
        case IMAGE_TYPE_SINT16:
            return Image<int16_t>::create(width, height, channels);
        case IMAGE_TYPE_SINT32:
            return Image<int32_t>::create(width, height, channels);
        case IMAGE_TYPE_SINT64:
            return Image<int64_t>::create(width, height, channels);
        case IMAGE_TYPE_FLOAT:
            return Image<float>::create(width, height, channels);
        case IMAGE_TYPE_DOUBLE:
            return Image<double>::create(width, height, channels);
        default:
            break;
    }

    return ImageBase::Ptr(nullptr);
}